

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LinearScan.cpp
# Opt level: O2

void __thiscall LinearScan::SetDstReg(LinearScan *this,Instr *instr)

{
  uint uVar1;
  Opnd *pOVar2;
  StackSym *this_00;
  Lifetime *this_01;
  Opnd *this_02;
  Opnd *this_03;
  code *pcVar3;
  bool bVar4;
  BOOLEAN BVar5;
  RegNum RVar6;
  uint uVar7;
  RegOpnd *regOpnd;
  undefined4 *puVar8;
  RegOpnd *pRVar9;
  SymOpnd *newDst;
  uint32 newUseValue;
  char *this_04;
  LinearScan *this_05;
  
  pOVar2 = instr->m_dst;
  if ((pOVar2 == (Opnd *)0x0) || (bVar4 = IR::Opnd::IsRegOpnd(pOVar2), !bVar4)) {
    return;
  }
  regOpnd = IR::Opnd::AsRegOpnd(pOVar2);
  if ((regOpnd->field_0x18 & 2) != 0) {
    BVUnitT<unsigned_long>::Set(&this->callSetupRegs,(uint)regOpnd->m_reg);
  }
  this_00 = regOpnd->m_sym;
  if ((this_00 == (StackSym *)0x0) || (bVar4 = StackSym::IsArgSlotSym(this_00), bVar4)) {
    RVar6 = regOpnd->m_reg;
    if (("\x01\f\f\f\n\x01\x01\x04\x04\f\f\f\f\n\n\n\n"[RVar6] & 1) == 0) {
      SpillReg(this,RVar6,false);
    }
    BVUnitT<unsigned_long>::Clear(&this->tempRegs,(uint)RVar6);
    return;
  }
  if (regOpnd->m_reg != RegNOREG) {
    RecordLoopUse(this,(Lifetime *)0x0,regOpnd->m_reg);
    return;
  }
  this_01 = *(Lifetime **)&(this_00->scratch).globOpt;
  newUseValue = 0;
  if (this->currentOpHelperBlock == (OpHelperBlock *)0x0) {
    uVar1 = this->loopNest;
    if (uVar1 < 6) {
      newUseValue = 1 << ((char)uVar1 * '\x03' & 0x1fU);
    }
    else {
      newUseValue = uVar1 * 0x8000 - 0x28000;
    }
  }
  Lifetime::SubFromUseCount(this_01,newUseValue,this->curLoop);
  if ((*(ushort *)&this_01->field_0x9c & 1) == 0) {
    if ((*(ushort *)&this_01->field_0x9c & 0x10) != 0) {
      if (this->currentOpHelperBlock == (OpHelperBlock *)0x0) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar8 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
        *puVar8 = 1;
        bVar4 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/LinearScan.cpp"
                           ,0x3c1,"(this->IsInHelperBlock())","this->IsInHelperBlock()");
        if (!bVar4) goto LAB_0053074e;
        *puVar8 = 0;
      }
      uVar1 = this_01->start;
      uVar7 = HelperBlockStartInstrNumber(this);
      if (uVar7 <= uVar1) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar8 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
        *puVar8 = 1;
        bVar4 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/LinearScan.cpp"
                           ,0x3c2,"(lifetime->start < this->HelperBlockStartInstrNumber())",
                           "lifetime->start < this->HelperBlockStartInstrNumber()");
        if (!bVar4) goto LAB_0053074e;
        *puVar8 = 0;
      }
      RVar6 = this_01->reg;
      BVar5 = BVUnitT<unsigned_long>::Test(&this->opHelperSpilledRegs,(uint)RVar6);
      if (BVar5 == '\0') {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar8 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
        *puVar8 = 1;
        bVar4 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/LinearScan.cpp"
                           ,0x3c5,"(this->opHelperSpilledRegs.Test(reg))",
                           "this->opHelperSpilledRegs.Test(reg)");
        if (!bVar4) goto LAB_0053074e;
        *puVar8 = 0;
      }
      BVar5 = BVUnitT<unsigned_long>::Test(&this->activeRegs,(uint)RVar6);
      if (BVar5 != '\0') {
        SpillReg(this,RVar6,false);
      }
      SetCantOpHelperSpill(this,this_01);
      AddToActive(this,this_01);
      BVUnitT<unsigned_long>::Clear(&this->tempRegs,(uint)RVar6);
      BVUnitT<unsigned_long>::Set(&this->activeRegs,(uint)RVar6);
      if ((ulong)RVar6 - 1 < 0x10) {
        this->intRegUsedCount = this->intRegUsedCount + 1;
      }
      else {
        if (0xf < (ulong)RVar6 - 0x11) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          puVar8 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
          *puVar8 = 1;
          bVar4 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/LinearScan.cpp"
                             ,0x3de,"(RegTypes[reg] == TyFloat64)","RegTypes[reg] == TyFloat64");
          if (!bVar4) goto LAB_0053074e;
          *puVar8 = 0;
        }
        this->floatRegUsedCount = this->floatRegUsedCount + 1;
      }
    }
    RecordDef(this,this_01,instr,newUseValue);
    this_05 = this;
    goto LAB_0053057b;
  }
  bVar4 = StackSym::IsConst(this_00);
  if ((bVar4) && (bVar4 = IsSymNonTempLocalVar(this,this_00), !bVar4)) {
    return;
  }
  RVar6 = regOpnd->m_reg;
  if (RVar6 == RegNOREG) {
    this_02 = instr->m_src1;
    this_03 = instr->m_src2;
    if ((((this_02 != (Opnd *)0x0) && (bVar4 = IR::Opnd::IsRegOpnd(this_02), bVar4)) &&
        (pRVar9 = IR::Opnd::AsRegOpnd(this_02), pRVar9->m_sym == this_00)) ||
       (((this_03 != (Opnd *)0x0 && (bVar4 = IR::Opnd::IsRegOpnd(this_03), bVar4)) &&
        (pRVar9 = IR::Opnd::AsRegOpnd(this_03), pRVar9->m_sym == this_00)))) {
      RVar6 = GetAssignedTempReg(this,this_01,pOVar2->m_type);
      if (RVar6 == RegNOREG) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar8 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
        *puVar8 = 1;
        bVar4 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/LinearScan.cpp"
                           ,0x37c,"(reg != RegNOREG)","reg != RegNOREG");
        if (!bVar4) goto LAB_0053074e;
        *puVar8 = 0;
      }
    }
    else {
      this_04 = (char *)this;
      RVar6 = SecondChanceAllocation(this,this_01,false);
      if (RVar6 != RegNOREG) {
        if ((this_00->field_0x18 & 1) != 0) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          puVar8 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
          *puVar8 = 1;
          this_04 = 
          "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/LinearScan.cpp"
          ;
          bVar4 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/LinearScan.cpp"
                             ,0x386,"(!stackSym->m_isSingleDef)","!stackSym->m_isSingleDef");
          if (!bVar4) goto LAB_0053074e;
          *puVar8 = 0;
        }
        SetReg((LinearScan *)this_04,regOpnd);
        RecordDef(this,this_01,instr,newUseValue);
        return;
      }
      RVar6 = GetAssignedTempReg(this,this_01,pOVar2->m_type);
    }
    RecordDef(this,this_01,instr,0);
    this_05 = (LinearScan *)instr;
    bVar4 = LowererMD::IsAssign(instr);
    if (bVar4) {
      this_05 = (LinearScan *)instr->m_src1;
      bVar4 = IR::Opnd::IsRegOpnd((Opnd *)this_05);
      if (bVar4) {
        if (RVar6 != RegNOREG) {
          BVUnitT<unsigned_long>::Clear(&this->tempRegs,(uint)RVar6);
        }
        newDst = IR::SymOpnd::New(&this_00->super_Sym,instr->m_src1->m_type,this->func);
        IR::Instr::ReplaceDst(instr,&newDst->super_Opnd);
        return;
      }
    }
    if (RVar6 == RegNOREG) {
      pOVar2 = instr->m_src1;
      if (((pOVar2 == (Opnd *)0x0) || (bVar4 = IR::Opnd::IsRegOpnd(pOVar2), !bVar4)) ||
         (pRVar9 = IR::Opnd::AsRegOpnd(pOVar2), pRVar9->m_sym != this_00)) {
        RVar6 = FindReg(this,(Lifetime *)0x0,regOpnd,false);
      }
      else {
        pRVar9 = IR::Opnd::AsRegOpnd(pOVar2);
        RVar6 = pRVar9->m_reg;
        BVar5 = BVUnitT<unsigned_long>::Test(&this->activeRegs,(uint)RVar6);
        if (BVar5 != '\0') {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          puVar8 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
          *puVar8 = 1;
          bVar4 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/LinearScan.cpp"
                             ,0x3aa,"(!this->activeRegs.Test(reg))","Shouldn\'t be active");
          if (!bVar4) {
LAB_0053074e:
            pcVar3 = (code *)invalidInstructionException();
            (*pcVar3)();
          }
          *puVar8 = 0;
        }
      }
      goto LAB_005303af;
    }
  }
  else {
LAB_005303af:
    this_05 = this;
    AssignTempReg(this,this_01,RVar6);
  }
  if ((*(ushort *)&this_01->field_0x9c & 0x208) == 0) {
    InsertStore(this,instr,regOpnd->m_sym,RVar6);
    this_05 = this;
  }
LAB_0053057b:
  SetReg(this_05,regOpnd);
  return;
}

Assistant:

void
LinearScan::SetDstReg(IR::Instr *instr)
{
    //
    // Enregister dst
    //

    IR::Opnd *dst = instr->GetDst();

    if (dst == nullptr)
    {
        return;
    }

    if (!dst->IsRegOpnd())
    {
        // This could be, for instance, a store to a sym with a large offset
        // that was just assigned when we saw the use.
        this->linearScanMD.LegalizeDef(instr);
        return;
    }

    IR::RegOpnd * regOpnd = dst->AsRegOpnd();
    /*
     * If this is a register used to setup a callsite per
     * a calling convention then mark it unavailable to allocate
     * until we see a CALL.
     */
    if (regOpnd->m_isCallArg)
    {
        RegNum callSetupReg = regOpnd->GetReg();
        callSetupRegs.Set(callSetupReg);
    }

    StackSym * stackSym = regOpnd->m_sym;

    // Arg slot sym can be in a RegOpnd for param passed via registers
    // Just use the assigned register
    if (stackSym == nullptr || stackSym->IsArgSlotSym())
    {
        //
        // Already allocated register. just spill the destination
        //
        RegNum reg = regOpnd->GetReg();
        if(LinearScan::IsAllocatable(reg))
        {
            this->SpillReg(reg);
        }
        this->tempRegs.Clear(reg);
    }
    else
    {
        if (regOpnd->GetReg() != RegNOREG)
        {
            this->RecordLoopUse(nullptr, regOpnd->GetReg());
            // Nothing to do
            return;
        }

        Lifetime * lifetime = stackSym->scratch.linearScan.lifetime;
        uint32 useCountCost = LinearScan::GetUseSpillCost(this->loopNest, (this->currentOpHelperBlock != nullptr));
        // Optimistically decrease the useCount.  We'll undo this if we put it on the defList.
        lifetime->SubFromUseCount(useCountCost, this->curLoop);

        if (lifetime->isSpilled)
        {
            if (stackSym->IsConst() && !IsSymNonTempLocalVar(stackSym))
            {
                // We will reload the constant (but in debug mode, we still need to process this if this is a user var).
                return;
            }

            RegNum reg = regOpnd->GetReg();

            if (reg != RegNOREG)
            {
                // It is already assigned, just record it as a temp reg
                this->AssignTempReg(lifetime, reg);
            }
            else
            {
                IR::Opnd *src1 = instr->GetSrc1();
                IR::Opnd *src2 = instr->GetSrc2();

                if ((src1 && src1->IsRegOpnd() && src1->AsRegOpnd()->m_sym == stackSym) ||
                    (src2 && src2->IsRegOpnd() && src2->AsRegOpnd()->m_sym == stackSym))
                {
                    // OpEQ: src1 should have a valid reg (put src2 for other targets)
                    reg = this->GetAssignedTempReg(lifetime, dst->GetType());
                    Assert(reg != RegNOREG);
                    RecordDef(lifetime, instr, 0);
                }
                else
                {
                    // Try second chance
                    reg = this->SecondChanceAllocation(lifetime, false);
                    if (reg != RegNOREG)
                    {

                        Assert(!stackSym->m_isSingleDef);

                        this->SetReg(regOpnd);
                        // Keep track of defs for this lifetime, in case it gets spilled.
                        RecordDef(lifetime, instr, useCountCost);
                        return;
                    }
                    else
                    {
                        reg = this->GetAssignedTempReg(lifetime, dst->GetType());
                        RecordDef(lifetime, instr, 0);
                    }
                }
                if (LowererMD::IsAssign(instr) && instr->GetSrc1()->IsRegOpnd())
                {
                    // Fold the spilled store
                    if (reg != RegNOREG)
                    {
                        // If the value is in a temp reg, it's not valid any more.
                        this->tempRegs.Clear(reg);
                    }

                    IRType srcType = instr->GetSrc1()->GetType();

                    instr->ReplaceDst(IR::SymOpnd::New(stackSym, srcType, this->func));
                    this->linearScanMD.LegalizeDef(instr);
                    return;
                }

                if (reg == RegNOREG)
                {
                    IR::Opnd *src = instr->GetSrc1();
                    if (src && src->IsRegOpnd() && src->AsRegOpnd()->m_sym == stackSym)
                    {
                        // Handle OPEQ's for x86/x64
                        reg = src->AsRegOpnd()->GetReg();
                        AssertMsg(!this->activeRegs.Test(reg), "Shouldn't be active");
                    }
                    else
                    {
                        // The lifetime was spilled, but we still need a reg for this operand.
                        reg = this->FindReg(nullptr, regOpnd);
                    }
                    this->AssignTempReg(lifetime, reg);
                }
            }

            if (!lifetime->isDeadStore && !lifetime->isSecondChanceAllocated)
            {
                // Insert a store since the lifetime is spilled
                this->InsertStore(instr, regOpnd->m_sym, reg);
            }
        }
        else
        {
            if (lifetime->isOpHelperSpilled)
            {
                // We must be in a helper block and the lifetime must
                // start before the helper block
                Assert(this->IsInHelperBlock());
                Assert(lifetime->start < this->HelperBlockStartInstrNumber());

                RegNum reg = lifetime->reg;
                Assert(this->opHelperSpilledRegs.Test(reg));

                if (this->activeRegs.Test(reg))
                {
                    // The reg must have been used locally in the helper block
                    // by some other lifetime. Just spill it

                    this->SpillReg(reg);
                }

                // We can't save/restore this reg across the helper call because the restore would overwrite
                // this def, but the def means we don't need to spill at all.  Mark the lifetime as cantOpHelperSpill
                // however in case another helper call in this block tries to spill it.
                this->SetCantOpHelperSpill(lifetime);

                this->AddToActive(lifetime);

                this->tempRegs.Clear(reg);
                this->activeRegs.Set(reg);
                if (RegTypes[reg] == TyMachReg)
                {
                    this->intRegUsedCount++;
                }
                else
                {
                    Assert(RegTypes[reg] == TyFloat64);
                    this->floatRegUsedCount++;
                }
            }

            // Keep track of defs for this lifetime, in case it gets spilled.
            RecordDef(lifetime, instr, useCountCost);
        }

        this->SetReg(regOpnd);
    }
}